

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection_p.h
# Opt level: O0

QHttp2Stream * __thiscall QHttp2Connection::promisedStream(QHttp2Connection *this,QUrl *streamKey)

{
  long lVar1;
  uint uVar2;
  QHttp2Stream *pQVar3;
  QHash<QUrl,_unsigned_int> *in_RSI;
  QUrl *in_RDI;
  long in_FS_OFFSET;
  quint32 id;
  uint *in_stack_ffffffffffffffb8;
  QHash<unsigned_int,_QPointer<QHttp2Stream>_> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QHash<QUrl,_unsigned_int>::value(in_RSI,in_RDI,in_stack_ffffffffffffffb8);
  if (uVar2 == 0) {
    pQVar3 = (QHttp2Stream *)0x0;
  }
  else {
    QHash<unsigned_int,_QPointer<QHttp2Stream>_>::value(in_stack_ffffffffffffffd8,(uint *)in_RDI);
    pQVar3 = QPointer::operator_cast_to_QHttp2Stream_((QPointer<QHttp2Stream> *)0x2d5ce8);
    QPointer<QHttp2Stream>::~QPointer((QPointer<QHttp2Stream> *)0x2d5cf7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QHttp2Stream *promisedStream(const QUrl &streamKey) const
    {
        if (quint32 id = m_promisedStreams.value(streamKey, 0); id)
            return m_streams.value(id);
        return nullptr;
    }